

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_srtp.cc
# Opt level: O3

stack_st_SRTP_PROTECTION_PROFILE * SSL_get_srtp_profiles(SSL *ssl)

{
  stack_st_SRTP_PROTECTION_PROFILE *psVar1;
  
  if (ssl == (SSL *)0x0) {
    return (stack_st_SRTP_PROTECTION_PROFILE *)0x0;
  }
  if (ssl->method != (SSL_METHOD *)0x0) {
    psVar1 = (stack_st_SRTP_PROTECTION_PROFILE *)ssl->method[1].ssl_new;
    if (psVar1 != (stack_st_SRTP_PROTECTION_PROFILE *)0x0) {
      return psVar1;
    }
    return *(stack_st_SRTP_PROTECTION_PROFILE **)(ssl->packet + 0x200);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/d1_srtp.cc"
                ,0x69,
                "const struct stack_st_SRTP_PROTECTION_PROFILE *SSL_get_srtp_profiles(const SSL *)")
  ;
}

Assistant:

const STACK_OF(SRTP_PROTECTION_PROFILE) *SSL_get_srtp_profiles(const SSL *ssl) {
  if (ssl == nullptr) {
    return nullptr;
  }

  if (ssl->config == nullptr) {
    assert(0);
    return nullptr;
  }

  return ssl->config->srtp_profiles != nullptr
             ? ssl->config->srtp_profiles.get()
             : ssl->ctx->srtp_profiles.get();
}